

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

char * kvtree_elem_get_first_val(kvtree *hash,char *key)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *pkVar2;
  char *pcVar3;
  
  pkVar2 = kvtree_elem_get(hash,key);
  if (((pkVar2 == (kvtree_elem *)0x0) || (pkVar2->hash == (kvtree_struct *)0x0)) ||
     (pkVar1 = pkVar2->hash->lh_first, pkVar1 == (kvtree_elem_struct *)0x0)) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = pkVar1->key;
  }
  return pcVar3;
}

Assistant:

char* kvtree_elem_get_first_val(const kvtree* hash, const char* key)
{
  /* lookup the hash, then return a pointer to the key of the first
   * element */
  char* v = NULL;
  kvtree* h = kvtree_get(hash, key);
  if (h != NULL) {
    kvtree_elem* e = kvtree_elem_first(h);
    if (e != NULL) {
      v = kvtree_elem_key(e);
    }
  }
  return v;
}